

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void __thiscall
wabt::WastParser::WastParser
          (WastParser *this,WastLexer *lexer,Errors *errors,WastParseOptions *options)

{
  long lVar1;
  
  this->lexer_ = lexer;
  this->last_module_index_ = 0xffffffff;
  this->errors_ = errors;
  this->options_ = options;
  memset(&this->resolve_types_,0,200);
  lVar1 = -0x90;
  do {
    *(undefined1 *)((long)this[1].tokens_.tokens._M_elems + lVar1 + -0x18) = 0;
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0);
  (this->tokens_).i = false;
  return;
}

Assistant:

WastParser::WastParser(WastLexer* lexer,
                       Errors* errors,
                       WastParseOptions* options)
    : lexer_(lexer), errors_(errors), options_(options) {}